

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

Belief * __thiscall despot::POMDPX::InitialBelief(POMDPX *this,State *start,string *type)

{
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar1;
  int iVar2;
  POMDPXBelief *this_00;
  double dVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_40;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_28;
  
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->is_small_ == true) {
    dVar3 = Parser::LogNumInitialStates(this->parser_);
    if (13.0 <= dVar3) goto LAB_0015cb0d;
    ExactInitialParticleSet(&local_58,this);
  }
  else {
LAB_0015cb0d:
    ApproxInitialParticleSet(&local_58,this);
  }
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    this_00 = (POMDPXBelief *)operator_new(0xa0);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_28,&local_78);
    POMDPXBelief::POMDPXBelief(this_00,&local_28,10,&this->super_DSPOMDP,(Belief *)0x0);
    if (local_28.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0015cbd9;
    pvVar1 = &local_28;
    local_40.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  else {
    this_00 = (POMDPXBelief *)operator_new(0x90);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_40,&local_78);
    ParticleBelief::ParticleBelief
              ((ParticleBelief *)this_00,&local_40,&this->super_DSPOMDP,(Belief *)0x0,true);
    if (local_40.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0015cbd9;
    pvVar1 = &local_40;
  }
  operator_delete(local_40.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)(pvVar1->
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
LAB_0015cbd9:
  if (local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Belief *)this_00;
}

Assistant:

Belief* POMDPX::InitialBelief(const State* start, string type) const {
	vector<State*> particles;
	if (is_small_ && parser_->LogNumInitialStates() < 13) { // Small problem
		particles = ExactInitialParticleSet();
	} else {
		particles = ApproxInitialParticleSet();
	}

	Belief* belief = NULL;
	if (type == "noisy")
		belief = new POMDPXBelief(particles, 10, this);
	else // if (type == "particle")
		belief = new ParticleBelief(particles, this);
	return belief;
}